

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreUtil.cpp
# Opt level: O2

ImageType vkt::image::getImageTypeForSingleLayer(ImageType imageType)

{
  if (imageType < IMAGE_TYPE_LAST) {
    return *(ImageType *)(&DAT_009d588c + (ulong)imageType * 4);
  }
  return IMAGE_TYPE_LAST;
}

Assistant:

ImageType getImageTypeForSingleLayer (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_1D_ARRAY:
			return IMAGE_TYPE_1D;

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			// A single layer for cube is a 2d face
			return IMAGE_TYPE_2D;

		case IMAGE_TYPE_3D:
			return IMAGE_TYPE_3D;

		case IMAGE_TYPE_BUFFER:
			return IMAGE_TYPE_BUFFER;

		default:
			DE_FATAL("Internal test error");
			return IMAGE_TYPE_LAST;
	}
}